

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O2

SubControl __thiscall QSliderPrivate::newHoverControl(QSliderPrivate *this,QPoint *pos)

{
  QRect *pQVar1;
  undefined8 uVar2;
  long lVar3;
  QWidget *this_00;
  char cVar4;
  QStyle *pQVar5;
  long lVar6;
  SubControl SVar7;
  bool bVar8;
  undefined8 *puVar9;
  QStyleOptionSlider *pQVar10;
  long in_FS_OFFSET;
  QRect local_e8;
  QRect local_d8;
  QRect local_c8;
  QStyleOptionSlider opt;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar9 = &DAT_00661f50;
  pQVar10 = &opt;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar2 = *puVar9;
    (pQVar10->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar2;
    (pQVar10->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar2 >> 0x20);
    puVar9 = puVar9 + 1;
    pQVar10 = (QStyleOptionSlider *)&(pQVar10->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&opt);
  opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar5 = QWidget::style(this_00);
  SVar7 = SC_ComboBoxEditField;
  local_c8 = (QRect)(**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,3,&opt,2,this_00);
  pQVar5 = QWidget::style(this_00);
  local_d8 = (QRect)(**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,3,&opt,1,this_00);
  pQVar5 = QWidget::style(this_00);
  local_e8 = (QRect)(**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,3,&opt,4,this_00);
  bVar8 = SUB81(pos,0);
  cVar4 = QRect::contains((QPoint *)&local_c8,bVar8);
  if (cVar4 == '\0') {
    cVar4 = QRect::contains((QPoint *)&local_d8,bVar8);
    if (cVar4 == '\0') {
      SVar7 = SC_None;
      cVar4 = QRect::contains((QPoint *)&local_e8,bVar8);
      pQVar1 = &this->hoverRect;
      if (cVar4 == '\0') {
        pQVar1->x1 = 0;
        pQVar1->y1 = 0;
        (this->hoverRect).x2 = -1;
        (this->hoverRect).y2 = -1;
      }
      else {
        *pQVar1 = local_e8;
        SVar7 = SC_ComboBoxArrow;
      }
    }
    else {
      this->hoverRect = local_d8;
      SVar7 = SC_ComboBoxFrame;
    }
  }
  else {
    this->hoverRect = local_c8;
  }
  this->hoverControl = SVar7;
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return SVar7;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QSliderPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QSlider);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    QRect handleRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderHandle, q);
    QRect grooveRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderGroove, q);
    QRect tickmarksRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderTickmarks, q);

    if (handleRect.contains(pos)) {
        hoverRect = handleRect;
        hoverControl = QStyle::SC_SliderHandle;
    } else if (grooveRect.contains(pos)) {
        hoverRect = grooveRect;
        hoverControl = QStyle::SC_SliderGroove;
    } else if (tickmarksRect.contains(pos)) {
        hoverRect = tickmarksRect;
        hoverControl = QStyle::SC_SliderTickmarks;
    } else {
        hoverRect = QRect();
        hoverControl = QStyle::SC_None;
    }

    return hoverControl;
}